

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationProblem.cpp
# Opt level: O3

void __thiscall
iDynTree::optimization::OptimizationProblem::OptimizationProblem(OptimizationProblem *this)

{
  OptimizationProblemInfoData *this_00;
  shared_ptr<iDynTree::optimization::OptimizationProblemInfoData> local_28;
  
  this->_vptr_OptimizationProblem = (_func_int **)&PTR__OptimizationProblem_0019a598;
  this_00 = (OptimizationProblemInfoData *)operator_new(8);
  OptimizationProblemInfoData::OptimizationProblemInfoData(this_00);
  (this->m_infoData).
  super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimization::OptimizationProblemInfoData*>
            (&(this->m_infoData).
              super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  local_28.
  super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (this->m_infoData).
            super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_28.
  super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (this->m_infoData).
       super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_28.
      super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.
       super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_28.
            super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.
       super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_28.
            super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  OptimizationProblemInfo::OptimizationProblemInfo(&this->m_info,&local_28);
  if (local_28.
      super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.
               super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

OptimizationProblem::OptimizationProblem()
        :m_infoData(new OptimizationProblemInfoData)
        ,m_info(m_infoData)
        {
        }